

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int create_slice(lua_State *L)

{
  lua_Integer lVar1;
  lua_Integer lVar2;
  int len;
  int start;
  lua_State *L_local;
  
  lVar1 = luaL_checkinteger(L,2);
  lVar2 = luaL_checkinteger(L,3);
  ravi_create_slice(L,1,(uint)lVar1,(uint)lVar2);
  return 1;
}

Assistant:

static int create_slice(lua_State *L) {
  int start = (int)luaL_checkinteger(L, 2);
  int len = (int)luaL_checkinteger(L, 3);
  ravi_create_slice(L, 1, start, len);
  return 1;
}